

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_merge_example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<glm::vec<2,_float,_(glm::qualifier)0>_> *this;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l_00;
  undefined1 local_150 [8];
  PolygonMerge merge;
  vec<2,_float,_(glm::qualifier)0> local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list2;
  allocator<glm::vec<2,_float,_(glm::qualifier)0>_> local_69;
  vec<2,_float,_(glm::qualifier)0> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list;
  char **argv_local;
  int argc_local;
  
  local_48 = 0x4120000041200000;
  local_58 = 0x42c8000042c80000;
  uStack_50 = 0x42c8000041200000;
  local_68.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x41200000;
  local_68.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x41200000;
  uStack_60 = 0x4120000042c80000;
  local_40 = &local_68;
  local_38 = 5;
  edge_list.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::allocator(&local_69);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_30,__l_00,&local_69);
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::~allocator(&local_69);
  local_b8 = 0x42a0000042a00000;
  uStack_b0 = 0x42a0000041a00000;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x41a00000;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x42a00000;
  uStack_c0 = 0x41a0000041a00000;
  local_a8 = &local_c8;
  local_a0 = 4;
  this = (allocator<glm::vec<2,_float,_(glm::qualifier)0>_> *)
         ((long)&merge.result_.
                 super__Vector_base<std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::allocator(this);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_98,__l,this);
  std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<2,_float,_(glm::qualifier)0>_> *)
             ((long)&merge.result_.
                     super__Vector_base<std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TRM::PolygonMerge::PolygonMerge((PolygonMerge *)local_150);
  TRM::PolygonMerge::do_merge
            ((PolygonMerge *)local_150,
             (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)local_30,
             (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)local_98);
  TRM::PolygonMerge::~PolygonMerge((PolygonMerge *)local_150);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_98);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_30);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::vector<glm::vec2> edge_list{
      {10, 10},
      {100, 10},
      {100, 100},
      {10, 100},
      {10, 10},
  };

  std::vector<glm::vec2> edge_list2{
      {20, 80},
      {20, 20},
      {80, 80},
      {20, 80},
  };


  TRM::PolygonMerge merge{};

  merge.do_merge(edge_list, edge_list2);


  return 0;
}